

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int parse_match_net(vec *vec,usa *sa,int no_strict)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  ushort *puVar8;
  ushort **ppuVar9;
  char cVar10;
  uint uVar11;
  char *pcVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  byte *pbVar16;
  int *piVar17;
  int n;
  uint slash;
  uint c;
  uint d;
  uint b;
  uint a;
  char ad [50];
  sockaddr_in6 sin6;
  
  piVar17 = &n;
  iVar5 = __isoc99_sscanf(vec->ptr,"%u.%u.%u.%u/%u%n",&a,&b,&c,&d,&slash,&n);
  if (iVar5 != 5) {
    slash = 0x20;
    iVar5 = __isoc99_sscanf(vec->ptr,"%u.%u.%u.%u%n",&a,&b,&c,&d,&n,piVar17);
    if (iVar5 != 4) {
      n = 0;
    }
  }
  if (((long)n < 1) || (vec->len != (long)n)) {
    pbVar16 = (byte *)ad;
    iVar5 = __isoc99_sscanf(vec->ptr,"[%49[^]]]/%u%n",pbVar16);
    if (iVar5 != 2) {
      slash = 0x80;
      iVar5 = __isoc99_sscanf(vec->ptr,"[%49[^]]]%n",ad);
      if (iVar5 != 1) {
        n = 0;
      }
    }
    if ((no_strict != 0) && (n < 1)) {
      pcVar12 = vec->ptr;
      pcVar6 = strchr(pcVar12,0x2f);
      if ((pcVar6 == (char *)0x0) || (pcVar12 + vec->len <= pcVar6)) {
        uVar15 = vec->len;
        if (uVar15 < 0x32) {
          n = (int)uVar15;
          slash = 0x80;
          cVar10 = *pcVar12;
          if (uVar15 == 0 || cVar10 == '\0') {
            pcVar6 = ad;
          }
          else {
            pcVar6 = ad;
            do {
              pcVar12 = pcVar12 + 1;
              *pcVar6 = cVar10;
              pcVar6 = pcVar6 + 1;
              cVar10 = *pcVar12;
              if (cVar10 == '\0') break;
              bVar2 = 1 < uVar15;
              uVar15 = uVar15 - 1;
            } while (bVar2);
          }
          *pcVar6 = '\0';
        }
      }
      else if (((ulong)((long)pcVar6 - (long)pcVar12) < 0x32) &&
              (iVar5 = __isoc99_sscanf(pcVar6,"/%u%n",&slash), iVar5 == 1)) {
        pcVar7 = vec->ptr;
        uVar15 = (long)pcVar6 - (long)pcVar7;
        n = n + (int)uVar15;
        cVar10 = *pcVar7;
        pcVar12 = ad;
        if (cVar10 != '\0') {
          uVar4 = uVar15 + 1;
          while (uVar3 = uVar15, 1 < uVar4) {
            pcVar7 = pcVar7 + 1;
            *pcVar12 = cVar10;
            pcVar12 = pcVar12 + 1;
            cVar10 = *pcVar7;
            if (cVar10 == '\0') break;
            uVar15 = uVar3 - 1;
            uVar4 = uVar3;
          }
        }
        *pcVar12 = '\0';
      }
      else {
        n = 0;
      }
    }
    puVar8 = (ushort *)(long)n;
    bVar2 = true;
    if (((0 < (long)puVar8) && ((ushort *)vec->len == puVar8)) && (slash < 0x81)) {
      c = 0;
      ppuVar9 = __ctype_b_loc();
      puVar8 = *ppuVar9;
      uVar11 = 0;
      while (((bVar1 = *pbVar16, (puVar8[bVar1] >> 0xc & 1) != 0 || (bVar1 == 0x3a)) ||
             (bVar1 == 0x2e))) {
        pbVar16 = pbVar16 + 1;
        if (bVar1 == 0x3a) {
          uVar11 = uVar11 + 1;
          c = uVar11;
        }
      }
      if ((bVar1 == 0) && (1 < c)) {
        bVar2 = false;
        puVar8 = (ushort *)0x0;
        if ((sa->sa).sa_family == 10) {
          uVar11 = mg_inet_pton(10,ad,&sin6,0x1c,0);
          puVar8 = (ushort *)(ulong)uVar11;
          if (uVar11 == 0) {
            bVar2 = true;
          }
          else {
            uVar15 = 8;
            lVar13 = 0;
            do {
              uVar11 = 0xff;
              if ((slash <= uVar15) && (uVar11 = 0, uVar15 - 8 < (ulong)slash)) {
                uVar11 = 0xff << ((char)uVar15 - (char)slash & 0x1fU);
              }
              if ((*(byte *)((long)sa + lVar13 + 8) & uVar11) !=
                  (uint)sin6.sin6_addr.__in6_u.__u6_addr8[lVar13]) {
                bVar2 = false;
                puVar8 = (ushort *)0x0;
                goto LAB_0012101f;
              }
              lVar13 = lVar13 + 1;
              uVar15 = uVar15 + 8;
            } while (lVar13 != 0x10);
            puVar8 = (ushort *)0x1;
            bVar2 = false;
          }
        }
      }
    }
LAB_0012101f:
    if (!bVar2) {
      return (int)puVar8;
    }
  }
  else if (slash < 0x21 && ((d < 0x100 && c < 0x100) && (b < 0x100 && a < 0x100))) {
    if ((sa->sa).sa_family != 2) {
      return 0;
    }
    uVar11 = (sa->sin6).sin6_flowinfo;
    uVar14 = -1 << (-(char)slash & 0x1fU);
    if (slash == 0) {
      uVar14 = 0;
    }
    return (uint)((uVar14 & (uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                            uVar11 << 0x18)) == (c << 8 | d | b << 0x10 | a << 0x18));
  }
  return -1;
}

Assistant:

static int
parse_match_net(const struct vec *vec, const union usa *sa, int no_strict)
{
	int n;
	unsigned int a, b, c, d, slash;

	if (sscanf(vec->ptr, "%u.%u.%u.%u/%u%n", &a, &b, &c, &d, &slash, &n)
	    != 5) { // NOLINT(cert-err34-c) 'sscanf' used to convert a string to an
		        // integer value, but function will not report conversion
		        // errors; consider using 'strtol' instead
		slash = 32;
		if (sscanf(vec->ptr, "%u.%u.%u.%u%n", &a, &b, &c, &d, &n)
		    != 4) { // NOLINT(cert-err34-c) 'sscanf' used to convert a string to
			        // an integer value, but function will not report conversion
			        // errors; consider using 'strtol' instead
			n = 0;
		}
	}

	if ((n > 0) && ((size_t)n == vec->len)) {
		if ((a < 256) && (b < 256) && (c < 256) && (d < 256) && (slash < 33)) {
			/* IPv4 format */
			if (sa->sa.sa_family == AF_INET) {
				uint32_t ip = ntohl(sa->sin.sin_addr.s_addr);
				uint32_t net = ((uint32_t)a << 24) | ((uint32_t)b << 16)
				               | ((uint32_t)c << 8) | (uint32_t)d;
				uint32_t mask = slash ? (0xFFFFFFFFu << (32 - slash)) : 0;
				return (ip & mask) == net;
			}
			return 0;
		}
	}
#if defined(USE_IPV6)
	else {
		char ad[50];
		const char *p;

		if (sscanf(vec->ptr, "[%49[^]]]/%u%n", ad, &slash, &n) != 2) {
			slash = 128;
			if (sscanf(vec->ptr, "[%49[^]]]%n", ad, &n) != 1) {
				n = 0;
			}
		}

		if ((n <= 0) && no_strict) {
			/* no square brackets? */
			p = strchr(vec->ptr, '/');
			if (p && (p < (vec->ptr + vec->len))) {
				if (((size_t)(p - vec->ptr) < sizeof(ad))
				    && (sscanf(p, "/%u%n", &slash, &n) == 1)) {
					n += (int)(p - vec->ptr);
					mg_strlcpy(ad, vec->ptr, (size_t)(p - vec->ptr) + 1);
				} else {
					n = 0;
				}
			} else if (vec->len < sizeof(ad)) {
				n = (int)vec->len;
				slash = 128;
				mg_strlcpy(ad, vec->ptr, vec->len + 1);
			}
		}

		if ((n > 0) && ((size_t)n == vec->len) && (slash < 129)) {
			p = ad;
			c = 0;
			/* zone indexes are unsupported, at least two colons are needed */
			while (isxdigit((unsigned char)*p) || (*p == '.') || (*p == ':')) {
				if (*(p++) == ':') {
					c++;
				}
			}
			if ((*p == '\0') && (c >= 2)) {
				struct sockaddr_in6 sin6;
				unsigned int i;

				/* for strict validation, an actual IPv6 argument is needed */
				if (sa->sa.sa_family != AF_INET6) {
					return 0;
				}
				if (mg_inet_pton(AF_INET6, ad, &sin6, sizeof(sin6), 0)) {
					/* IPv6 format */
					for (i = 0; i < 16; i++) {
						uint8_t ip = sa->sin6.sin6_addr.s6_addr[i];
						uint8_t net = sin6.sin6_addr.s6_addr[i];
						uint8_t mask = 0;

						if (8 * i + 8 < slash) {
							mask = 0xFFu;
						} else if (8 * i < slash) {
							mask = (uint8_t)(0xFFu << (8 * i + 8 - slash));
						}
						if ((ip & mask) != net) {
							return 0;
						}
					}
					return 1;
				}
			}
		}
	}
#else
	(void)no_strict;
#endif

	/* malformed */
	return -1;
}